

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::StringSegment::StringSegment
          (StringSegment *this,UnicodeString *str,bool ignoreCase)

{
  int32_t iVar1;
  bool ignoreCase_local;
  UnicodeString *str_local;
  StringSegment *this_local;
  
  icu_63::UnicodeString::UnicodeString(&this->fStr,str);
  this->fStart = 0;
  iVar1 = icu_63::UnicodeString::length(str);
  this->fEnd = iVar1;
  this->fFoldCase = ignoreCase;
  return;
}

Assistant:

StringSegment::StringSegment(const UnicodeString& str, bool ignoreCase)
        : fStr(str), fStart(0), fEnd(str.length()),
          fFoldCase(ignoreCase) {}